

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_class_24_3_00107f24 chain;
  string_view value_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  cmExecutionStatus *name;
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 *puVar7;
  value_type *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  cmMakefile *this;
  anon_class_8_1_ba1d59bf current;
  string *in_R8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar10;
  bool local_209;
  bool local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  size_t local_1b8;
  const_reference pvStack_1b0;
  cmExecutionStatus *local_1a8;
  const_reference local_1a0;
  undefined1 local_198 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  value_type *key;
  size_t i;
  string result_list;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  allocator<char> local_e9;
  string local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  size_t local_b8;
  char *local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  cmExecutionStatus *local_98;
  value_type *variable;
  allocator<char> local_79;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *local_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  value_type *local_28;
  size_t current_index;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_28 = (value_type *)0x0;
  current_index = (size_t)status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  local_1f1 = true;
  if ((long)local_28 + 2U <= sVar5) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(size_type)local_28);
    local_38 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
    local_58 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("RESULT",6);
    local_48 = local_58._M_len;
    local_40 = local_58._M_str;
    local_1f1 = std::operator!=(local_38,local_58);
  }
  sVar1 = current_index;
  if (local_1f1 == false) {
    local_98 = (cmExecutionStatus *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(long)local_28 + 1);
    local_28 = (value_type *)((long)local_28 + 2);
    puVar7 = (undefined1 *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    local_209 = true;
    if (&local_28->field_0x2 <= puVar7) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(size_type)local_28);
      local_a8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
      local_c8 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("QUERY",5);
      local_b8 = local_c8._M_len;
      local_b0 = local_c8._M_str;
      local_209 = std::operator!=(local_a8,local_c8);
    }
    sVar1 = current_index;
    if (local_209 == false) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(size_type)&local_28->field_0x1);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
      __y = (basic_string_view<char,_std::char_traits<char>_>)
            cm::operator____s("WINDOWS_REGISTRY",0x10);
      bVar2 = std::operator==(__x,__y);
      if (bVar2) {
        join_0x00000010_0x00000000_ =
             cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local);
        cVar10 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)((long)&result_list.field_2 + 8),(difference_type)&local_28->field_0x2
                          );
        local_130 = cVar10.Begin._M_current;
        local_128 = cVar10.End._M_current;
        cVar10.End._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)current_index;
        cVar10.Begin._M_current = local_128._M_current;
        args_local._7_1_ =
             (anonymous_namespace)::
             QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                       ((_anonymous_namespace_ *)local_130._M_current,cVar10,local_98,in_R8);
      }
      else {
        if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
            ::info == '\0') {
          iVar4 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::info);
          if (iVar4 != 0) {
            cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
            __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                         &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
            __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::info);
          }
        }
        if ((cmCMakeHostSystemInformationCommand::initialized & 1U) == 0) {
          cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
          cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
          cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
          cmCMakeHostSystemInformationCommand::initialized = true;
        }
        std::__cxx11::string::string((string *)&i);
        key = local_28;
        do {
          key = (value_type *)&key->field_0x1;
          pvVar8 = (value_type *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local);
          if (pvVar8 <= key) {
            this = cmExecutionStatus::GetMakefile((cmExecutionStatus *)current_index);
            name = local_98;
            value_00 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&i);
            cmMakefile::AddDefinition(this,(string *)name,value_00);
            args_local._7_1_ = 1;
            break;
          }
          bVar3 = std::__cxx11::string::empty();
          std::__cxx11::string::operator+=
                    ((string *)&i,
                     (string *)((anonymous_namespace)::DELIM_abi_cxx11_ + (ulong)(bVar3 ^ 1) * 0x20)
                    );
          pvStack_1b0 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)status_local,(size_type)key);
          local_1b8 = current_index;
          local_1a8 = local_98;
          chain.key = pvStack_1b0;
          chain.status = (cmExecutionStatus *)current_index;
          chain.variable = (value_type *)local_98;
          local_1a0 = pvStack_1b0;
          value.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = pvStack_1b0;
          (anonymous_namespace)::
          GetValueChained<cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0,cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__1>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_198,(_anonymous_namespace_ *)pvStack_1b0,current,chain);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_198);
          sVar1 = current_index;
          if (bVar2) {
            pbVar9 = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_198);
            std::__cxx11::string::operator+=((string *)&i,(string *)pbVar9);
          }
          else {
            std::operator+(&local_1d8,"does not recognize <key> ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           value.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._32_8_);
            cmExecutionStatus::SetError((cmExecutionStatus *)sVar1,&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            args_local._7_1_ = 0;
          }
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_198);
        } while (bVar2);
        std::__cxx11::string::~string((string *)&i);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"missing QUERY specification",&local_e9);
      cmExecutionStatus::SetError((cmExecutionStatus *)sVar1,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      args_local._7_1_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"missing RESULT specification.",&local_79);
    cmExecutionStatus::SetError((cmExecutionStatus *)sVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetValue(status, key, variable); }
#ifdef HAVE_VS_SETUP_HELPER
        , [&]() { return GetValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}